

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPerformanceHistory::IfcPerformanceHistory(IfcPerformanceHistory *this)

{
  *(undefined ***)&this->field_0x110 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x118 = 0;
  *(char **)&this->field_0x120 = "IfcPerformanceHistory";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__0080e8e0);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPerformanceHistory,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x80e800;
  *(undefined8 *)&this->field_0x110 = 0x80e8c8;
  *(undefined8 *)&this->field_0x88 = 0x80e828;
  *(undefined8 *)&this->field_0x98 = 0x80e850;
  *(undefined8 *)&this->field_0xd0 = 0x80e878;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPerformanceHistory,_1UL>)._vptr_ObjectHelper
       = (_func_int **)0x80e8a0;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPerformanceHistory,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPerformanceHistory,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPerformanceHistory,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPerformanceHistory,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcPerformanceHistory() : Object("IfcPerformanceHistory") {}